

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarManSimulate(Ssw_RarMan_t *p,Vec_Int_t *vInit,int fUpdate,int fFirst)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  word *pwVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  word *pwVar8;
  word *pwVar9;
  ulong uVar10;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vCands;
  int i;
  int w;
  word Flip1;
  word Flip0;
  word Flip;
  word *pSim1;
  word *pSim0;
  word *pSim;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  int fFirst_local;
  int fUpdate_local;
  Vec_Int_t *vInit_local;
  Ssw_RarMan_t *p_local;
  
  Ssw_RarManInitialize(p,vInit);
  Vec_PtrClear(p->vUpdConst);
  Vec_PtrClear(p->vUpdClass);
  Aig_ManIncrementTravId(p->pAig);
  if (fUpdate != 0) {
    for (vCands._0_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), (int)vCands < iVar1;
        vCands._0_4_ = (int)vCands + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,(int)vCands);
      pAVar6 = Aig_ObjRepr(p->pAig,pAVar3);
      if (((pAVar6 != (Aig_Obj_t *)0x0) &&
          (iVar1 = Aig_ObjIsTravIdCurrent(p->pAig,pAVar6), iVar1 == 0)) &&
         (iVar1 = Ssw_RarManObjsAreEqual(p,pAVar3,pAVar6), iVar1 == 0)) {
        pAVar7 = Aig_ManConst1(p->pAig);
        if (pAVar6 == pAVar7) {
          Vec_PtrPush(p->vUpdConst,pAVar3);
        }
        else {
          Vec_PtrPush(p->vUpdClass,pAVar6);
          Aig_ObjSetTravIdCurrent(p->pAig,pAVar6);
        }
      }
    }
  }
  for (vCands._0_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), (int)vCands < iVar1;
      vCands._0_4_ = (int)vCands + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,(int)vCands);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      iVar1 = Aig_ObjId(pAVar3);
      pwVar8 = Ssw_RarObjSim(p,iVar1);
      iVar1 = Aig_ObjFaninId0(pAVar3);
      pwVar9 = Ssw_RarObjSim(p,iVar1);
      iVar1 = Aig_ObjFaninId1(pAVar3);
      pwVar4 = Ssw_RarObjSim(p,iVar1);
      iVar1 = Aig_ObjFaninC0(pAVar3);
      uVar10 = 0;
      if (iVar1 != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      iVar1 = Aig_ObjFaninC1(pAVar3);
      uVar5 = 0;
      if (iVar1 != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      for (vCands._4_4_ = 0; vCands._4_4_ < p->pPars->nWords; vCands._4_4_ = vCands._4_4_ + 1) {
        pwVar8[vCands._4_4_] = (uVar10 ^ pwVar9[vCands._4_4_]) & (uVar5 ^ pwVar4[vCands._4_4_]);
      }
      if ((((fUpdate != 0) && (pAVar6 = Aig_ObjRepr(p->pAig,pAVar3), pAVar6 != (Aig_Obj_t *)0x0)) &&
          (iVar1 = Aig_ObjIsTravIdCurrent(p->pAig,pAVar6), iVar1 == 0)) &&
         (iVar1 = Ssw_RarManObjsAreEqual(p,pAVar3,pAVar6), iVar1 == 0)) {
        pAVar7 = Aig_ManConst1(p->pAig);
        if (pAVar6 == pAVar7) {
          Vec_PtrPush(p->vUpdConst,pAVar3);
        }
        else {
          Vec_PtrPush(p->vUpdClass,pAVar6);
          Aig_ObjSetTravIdCurrent(p->pAig,pAVar6);
        }
      }
    }
  }
  for (vCands._0_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vCos), (int)vCands < iVar1;
      vCands._0_4_ = (int)vCands + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,(int)vCands);
    iVar1 = Aig_ObjId(pAVar3);
    pwVar8 = Ssw_RarObjSim(p,iVar1);
    iVar1 = Aig_ObjFaninId0(pAVar3);
    pwVar9 = Ssw_RarObjSim(p,iVar1);
    iVar1 = Aig_ObjFaninC0(pAVar3);
    uVar10 = 0;
    if (iVar1 != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    for (vCands._4_4_ = 0; vCands._4_4_ < p->pPars->nWords; vCands._4_4_ = vCands._4_4_ + 1) {
      pwVar8[vCands._4_4_] = uVar10 ^ pwVar9[vCands._4_4_];
    }
  }
  if (fUpdate != 0) {
    if (fFirst == 0) {
      Ssw_ClassesRefineConst1Group(p->ppClasses,p->vUpdConst,1);
      Ssw_ClassesRefineGroup(p->ppClasses,p->vUpdClass,1);
    }
    else {
      p_00 = Vec_PtrAlloc(1000);
      for (vCands._0_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), (int)vCands < iVar1;
          vCands._0_4_ = (int)vCands + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,(int)vCands);
        if ((pAVar3 != (Aig_Obj_t *)0x0) &&
           (iVar1 = Ssw_ObjIsConst1Cand(p->pAig,pAVar3), iVar1 != 0)) {
          Vec_PtrPush(p_00,pAVar3);
        }
      }
      iVar1 = Vec_PtrSize(p_00);
      iVar2 = Ssw_ClassesCand1Num(p->ppClasses);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                      ,0x2d7,"void Ssw_RarManSimulate(Ssw_RarMan_t *, Vec_Int_t *, int, int)");
      }
      Ssw_ClassesPrepareRehash(p->ppClasses,p_00,0);
      Vec_PtrFree(p_00);
    }
  }
  return;
}

Assistant:

void Ssw_RarManSimulate( Ssw_RarMan_t * p, Vec_Int_t * vInit, int fUpdate, int fFirst )
{
    Aig_Obj_t * pObj, * pRepr;
    word * pSim, * pSim0, * pSim1;
    word Flip, Flip0, Flip1;
    int w, i;
    // initialize
    Ssw_RarManInitialize( p, vInit );
    Vec_PtrClear( p->vUpdConst );
    Vec_PtrClear( p->vUpdClass );
    Aig_ManIncrementTravId( p->pAig );
    // check comb inputs
    if ( fUpdate )
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // simulate
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        pSim1 = Ssw_RarObjSim( p, Aig_ObjFaninId1(pObj) );
        Flip0 = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        Flip1 = Aig_ObjFaninC1(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = (Flip0 ^ pSim0[w]) & (Flip1 ^ pSim1[w]);


        if ( !fUpdate )
            continue;
        // check classes
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // transfer to POs
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        Flip  = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Flip ^ pSim0[w];
    }
    // refine classes
    if ( fUpdate )
    {
        if ( fFirst )
        {
            Vec_Ptr_t * vCands = Vec_PtrAlloc( 1000 );
            Aig_ManForEachObj( p->pAig, pObj, i )
                if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                    Vec_PtrPush( vCands, pObj );
            assert( Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses) );
            Ssw_ClassesPrepareRehash( p->ppClasses, vCands, 0 );
            Vec_PtrFree( vCands );
        }
        else
        {
            Ssw_ClassesRefineConst1Group( p->ppClasses, p->vUpdConst, 1 );
            Ssw_ClassesRefineGroup( p->ppClasses, p->vUpdClass, 1 );
        }
    }
}